

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  int path2;
  size_type sVar1;
  long *plVar2;
  bool bVar3;
  EnumDescriptorProto *enum_type;
  DescriptorProto *message_00;
  MessageOptions *options;
  OneofDescriptorProto *oneof_decl;
  FieldDescriptorProto *field;
  string_view text;
  string_view text_00;
  string_view text_01;
  LocationRecorder location;
  LocationRecorder local_48;
  
  text._M_str = ";";
  text._M_len = 1;
  bVar3 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  if (bVar3) {
    return true;
  }
  sVar1 = (this->input_->current_).text._M_string_length;
  if (sVar1 - 4 < 7) {
    plVar2 = (long *)(this->input_->current_).text._M_dataplus._M_p;
    switch(sVar1) {
    case 4:
      if ((int)*plVar2 == 0x6d756e65) {
        LocationRecorder::LocationRecorder
                  (&local_48,message_location,4,*(int *)((long)&message->field_0 + 0x40));
        enum_type = (EnumDescriptorProto *)
                    internal::RepeatedPtrFieldBase::AddMessageLite
                              (&(message->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                               Arena::DefaultConstruct<google::protobuf::EnumDescriptorProto>);
        bVar3 = ParseEnumDefinition(this,enum_type,&local_48,containing_file);
        goto LAB_001d166c;
      }
      break;
    case 6:
      if (*(short *)((long)plVar2 + 4) == 0x646e && (int)*plVar2 == 0x65747865) {
        LocationRecorder::LocationRecorder(&local_48,message_location,6);
        bVar3 = ParseExtend(this,&(message->field_0)._impl_.extension_,
                            &(message->field_0)._impl_.nested_type_,message_location,3,&local_48,
                            containing_file);
        goto LAB_001d166c;
      }
      break;
    case 7:
      if (*(int *)((long)plVar2 + 3) == 0x65676173 && (int)*plVar2 == 0x7373656d) {
        LocationRecorder::LocationRecorder
                  (&local_48,message_location,3,*(int *)((long)&message->field_0 + 0x28));
        message_00 = (DescriptorProto *)
                     internal::RepeatedPtrFieldBase::AddMessageLite
                               (&(message->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                                Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
        bVar3 = ParseMessageDefinition(this,message_00,&local_48,containing_file);
        goto LAB_001d166c;
      }
      break;
    case 8:
      if (*plVar2 == 0x6465767265736572) {
        bVar3 = ParseReserved(this,message,message_location);
        return bVar3;
      }
      break;
    case 10:
      if ((short)plVar2[1] == 0x736e && *plVar2 == 0x6f69736e65747865) {
        LocationRecorder::LocationRecorder(&local_48,message_location,5);
        bVar3 = ParseExtensions(this,message,&local_48,containing_file);
        goto LAB_001d166c;
      }
    }
  }
  text_00._M_str = "option";
  text_00._M_len = 6;
  bVar3 = LookingAt(this,text_00);
  if (bVar3) {
    LocationRecorder::LocationRecorder(&local_48,message_location,7);
    options = DescriptorProto::mutable_options(message);
    bVar3 = ParseOption(this,&options->super_Message,&local_48,containing_file,OPTION_STATEMENT);
  }
  else {
    text_01._M_str = "oneof";
    text_01._M_len = 5;
    bVar3 = LookingAt(this,text_01);
    if (bVar3) {
      path2 = *(int *)((long)&message->field_0 + 0x88);
      LocationRecorder::LocationRecorder(&local_48,message_location,8,path2);
      oneof_decl = (OneofDescriptorProto *)
                   internal::RepeatedPtrFieldBase::AddMessageLite
                             (&(message->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                              Arena::DefaultConstruct<google::protobuf::OneofDescriptorProto>);
      bVar3 = ParseOneof(this,oneof_decl,message,path2,&local_48,message_location,containing_file);
    }
    else {
      LocationRecorder::LocationRecorder
                (&local_48,message_location,2,*(int *)((long)&message->field_0 + 0x10));
      field = (FieldDescriptorProto *)
              internal::RepeatedPtrFieldBase::AddMessageLite
                        (&(message->field_0)._impl_.field_.super_RepeatedPtrFieldBase,
                         Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
      bVar3 = ParseMessageField(this,field,&(message->field_0)._impl_.nested_type_,message_location,
                                3,&local_48,containing_file);
    }
  }
LAB_001d166c:
  LocationRecorder::~LocationRecorder(&local_48);
  return bVar3;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), location,
                                  containing_file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), location,
                               containing_file);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location, containing_file);
  } else if (LookingAt("reserved")) {
    return ParseReserved(message, message_location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(), message_location,
                       DescriptorProto::kNestedTypeFieldNumber, location,
                       containing_file);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else if (LookingAt("oneof")) {
    int oneof_index = message->oneof_decl_size();
    LocationRecorder oneof_location(
        message_location, DescriptorProto::kOneofDeclFieldNumber, oneof_index);

    return ParseOneof(message->add_oneof_decl(), message, oneof_index,
                      oneof_location, message_location, containing_file);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(
        message->add_field(), message->mutable_nested_type(), message_location,
        DescriptorProto::kNestedTypeFieldNumber, location, containing_file);
  }
}